

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

int nn_req_events(nn_sockbase *self)

{
  return *(int *)&self[0x37].sock == 8 | 2;
}

Assistant:

int nn_req_events (struct nn_sockbase *self)
{
    int rc;
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  OUT is signalled all the time because sending a request while
        another one is being processed cancels the old one. */
    rc = NN_SOCKBASE_EVENT_OUT;

    /*  In DONE state the reply is stored in 'reply' field. */
    if (req->state == NN_REQ_STATE_DONE)
        rc |= NN_SOCKBASE_EVENT_IN;

    return rc;
}